

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

VirtualInterfaceType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::VirtualInterfaceType,slang::ast::InstanceSymbol_const&,slang::ast::ModportSymbol_const*&,bool,slang::SourceLocation>
          (BumpAllocator *this,InstanceSymbol *args,ModportSymbol **args_1,bool *args_2,
          SourceLocation *args_3)

{
  bool bVar1;
  ModportSymbol *pMVar2;
  SourceLocation SVar3;
  VirtualInterfaceType *pVVar4;
  
  pVVar4 = (VirtualInterfaceType *)allocate(this,0x60,8);
  pMVar2 = *args_1;
  bVar1 = *args_2;
  SVar3 = *args_3;
  (pVVar4->super_Type).super_Symbol.kind = VirtualInterfaceType;
  (pVVar4->super_Type).super_Symbol.name._M_len = 0;
  (pVVar4->super_Type).super_Symbol.name._M_str = "";
  (pVVar4->super_Type).super_Symbol.location = SVar3;
  (pVVar4->super_Type).super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (pVVar4->super_Type).super_Symbol.parentScope = (Scope *)0x0;
  (pVVar4->super_Type).super_Symbol.nextInScope = (Symbol *)0x0;
  (pVVar4->super_Type).super_Symbol.indexInScope = 0;
  (pVVar4->super_Type).canonical = (Type *)pVVar4;
  pVVar4->iface = args;
  pVVar4->modport = pMVar2;
  pVVar4->isRealIface = bVar1;
  return pVVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }